

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalGenerator::ComputeTargetDepends(cmGlobalGenerator *this)

{
  cmGeneratorTarget *t;
  bool bVar1;
  mapped_type *deps;
  pointer __k;
  cmComputeTargetDepends ctd;
  cmComputeTargetDepends local_e0;
  
  cmComputeTargetDepends::cmComputeTargetDepends(&local_e0,this);
  bVar1 = cmComputeTargetDepends::Compute(&local_e0);
  if ((bVar1) &&
     (local_e0.Targets.
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_e0.Targets.
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    __k = local_e0.Targets.
          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
          _M_impl.super__Vector_impl_data._M_start;
    do {
      t = *__k;
      deps = std::
             map<const_cmGeneratorTarget_*,_cmTargetDependSet,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmTargetDependSet>_>_>
             ::operator[](&this->TargetDependencies,__k);
      cmComputeTargetDepends::GetTargetDirectDepends(&local_e0,t,deps);
      __k = __k + 1;
    } while (__k != local_e0.Targets.
                    super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmComputeTargetDepends::~cmComputeTargetDepends(&local_e0);
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::ComputeTargetDepends()
{
  cmComputeTargetDepends ctd(this);
  if(!ctd.Compute())
    {
    return false;
    }
  std::vector<cmGeneratorTarget const*> const& targets = ctd.GetTargets();
  for(std::vector<cmGeneratorTarget const*>::const_iterator ti
      = targets.begin(); ti != targets.end(); ++ti)
    {
    ctd.GetTargetDirectDepends(*ti, this->TargetDependencies[*ti]);
    }
  return true;
}